

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivPrintOne(Gia_Man_t *p,int i,int Counter)

{
  uint uVar1;
  int iVar2;
  uint local_1c;
  int Ent;
  int Counter_local;
  int i_local;
  Gia_Man_t *p_local;
  
  uVar1 = Gia_ManEquivCountOne(p,i);
  Abc_Print(1,"Class %4d :  Num = %2d  {",(ulong)(uint)Counter,(ulong)uVar1);
  iVar2 = Gia_ObjIsHead(p,i);
  local_1c = i;
  if (iVar2 == 0) {
    __assert_fail("Gia_ObjIsHead(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x1cb,"void Gia_ManEquivPrintOne(Gia_Man_t *, int, int)");
  }
  for (; 0 < (int)local_1c; local_1c = Gia_ObjNext(p,local_1c)) {
    Abc_Print(1," %d",(ulong)local_1c);
    if ((((uint)p->pReprs[(int)local_1c] >> 0x1e & 1) != 0) || ((int)p->pReprs[(int)local_1c] < 0))
    {
      Abc_Print(1," <%d%d>",(ulong)((uint)p->pReprs[(int)local_1c] >> 0x1e & 1),
                (ulong)((uint)p->pReprs[(int)local_1c] >> 0x1f));
    }
  }
  Abc_Print(1," }\n");
  return;
}

Assistant:

void Gia_ManEquivPrintOne( Gia_Man_t * p, int i, int Counter )
{
    int Ent;
    Abc_Print( 1, "Class %4d :  Num = %2d  {", Counter, Gia_ManEquivCountOne(p, i) );
    Gia_ClassForEachObj( p, i, Ent )
    {
        Abc_Print( 1," %d", Ent );
        if ( p->pReprs[Ent].fColorA || p->pReprs[Ent].fColorB )
            Abc_Print( 1," <%d%d>", p->pReprs[Ent].fColorA, p->pReprs[Ent].fColorB );
    }
    Abc_Print( 1, " }\n" );
}